

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O0

void test_linear_hash_bucket_map_head_updates(planck_unit_test_t *tc)

{
  long lVar1;
  linear_hash_table_t *plVar2;
  planck_unit_result_t pVar3;
  int iVar4;
  ion_fpos_t iVar5;
  ion_fpos_t total_record_size;
  undefined4 local_30;
  int local_2c;
  undefined4 local_28;
  int i;
  long local_20;
  ion_fpos_t expected_bucket_head;
  linear_hash_table_t *linear_hash;
  planck_unit_test_t *tc_local;
  
  linear_hash = (linear_hash_table_t *)tc;
  expected_bucket_head = (ion_fpos_t)malloc(0x78);
  test_linear_hash_setup
            ((planck_unit_test_t *)linear_hash,(linear_hash_table_t *)expected_bucket_head);
  local_20 = 0;
  i = 0;
  local_28 = 0x13;
  test_linear_hash_insert
            ((planck_unit_test_t *)linear_hash,&i,&local_28,'\0',1,'\x01',
             (linear_hash_table_t *)expected_bucket_head);
  plVar2 = linear_hash;
  lVar1 = local_20;
  iVar5 = array_list_get(0,*(array_list_t **)(expected_bucket_head + 0x58));
  pVar3 = planck_unit_assert_true
                    ((planck_unit_test_t *)plVar2,(uint)(lVar1 == iVar5),0xf6,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                     ,"condition was false, expected true");
  if (pVar3 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  for (local_2c = 0; plVar2 = linear_hash, lVar1 = local_20,
      local_2c < *(int *)(expected_bucket_head + 0x38); local_2c = local_2c + 1) {
    local_30 = 0;
    total_record_size._4_4_ = 0x13;
    test_linear_hash_insert
              ((planck_unit_test_t *)linear_hash,&local_30,
               (ion_value_t)((long)&total_record_size + 4),'\0',1,'\x01',
               (linear_hash_table_t *)expected_bucket_head);
  }
  iVar5 = array_list_get(0,*(array_list_t **)(expected_bucket_head + 0x58));
  pVar3 = planck_unit_assert_true
                    ((planck_unit_test_t *)plVar2,(uint)(lVar1 != iVar5),0x100,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                     ,"condition was false, expected true");
  if (pVar3 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  iVar4 = fseek(*(FILE **)(expected_bucket_head + 0x48),
                ((long)(*(int *)(expected_bucket_head + 4) + *(int *)(expected_bucket_head + 8)) + 1
                ) * -4 + -0x10,2);
  plVar2 = linear_hash;
  local_20 = (long)iVar4;
  iVar5 = array_list_get(0,*(array_list_t **)(expected_bucket_head + 0x58));
  pVar3 = planck_unit_assert_true
                    ((planck_unit_test_t *)plVar2,(uint)(iVar4 != iVar5),0x106,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                     ,"condition was false, expected true");
  if (pVar3 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  test_linear_hash_takedown
            ((planck_unit_test_t *)linear_hash,(linear_hash_table_t *)expected_bucket_head);
  return;
}

Assistant:

void
test_linear_hash_bucket_map_head_updates(
	planck_unit_test_t *tc
) {
	linear_hash_table_t *linear_hash = malloc(sizeof(linear_hash_table_t));

	test_linear_hash_setup(tc, linear_hash);

	ion_fpos_t expected_bucket_head = 0;

	/* base case -- assuming bucket 0 is inserted to */
	test_linear_hash_insert(tc, IONIZE(0, int), IONIZE(19, int), err_ok, 1, boolean_true, linear_hash);
	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_head == array_list_get(0, linear_hash->bucket_map));

	/* fill bucket 0 and cause the generation of an overflow */
	int i;

	for (i = 0; i < linear_hash->records_per_bucket; i++) {
		test_linear_hash_insert(tc, IONIZE(0, int), IONIZE(19, int), err_ok, 1, boolean_true, linear_hash);
	}

	/* test that the head of 0 index bucket linked list in the bucket map has changed */
	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_head != array_list_get(0, linear_hash->bucket_map));

	ion_fpos_t total_record_size = linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(ion_byte_t);

	/* test that the new head of 0 index bucket is at the correct location */
	expected_bucket_head = fseek(linear_hash->database, -4 * total_record_size - sizeof(linear_hash_bucket_t), SEEK_END);
	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_head != array_list_get(0, linear_hash->bucket_map));

	test_linear_hash_takedown(tc, linear_hash);
}